

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

wostream * Centaurus::operator<<(wostream *os,PriorityChain *chain)

{
  size_type sVar1;
  const_reference e;
  wostream *pwVar2;
  undefined4 local_1c;
  int i;
  PriorityChain *chain_local;
  wostream *os_local;
  
  std::operator<<(os,L'{');
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
            ::size(&chain->
                    super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                  );
    if (sVar1 <= (ulong)(long)(local_1c + 1)) break;
    e = std::
        vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>::
        operator[](&chain->
                    super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ,(long)local_1c);
    pwVar2 = operator<<(os,e);
    std::operator<<(pwVar2,L'>');
    local_1c = local_1c + 1;
  }
  std::operator<<(os,L'}');
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const PriorityChain& chain)
{
    os << L'{';
    for (int i = 0; i + 1 < chain.size(); i++)
    {
        os << chain[i] << L'>';
    }
    os << L'}';
    return os;
}